

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcFilterType::IfcFilterType(IfcFilterType *this)

{
  *(undefined ***)&this->field_0x1e0 = &PTR__Object_0087f260;
  *(undefined8 *)&this->field_0x1e8 = 0;
  *(char **)&this->field_0x1f0 = "IfcFilterType";
  Schema_2x3::IfcFlowTreatmentDeviceType::IfcFlowTreatmentDeviceType
            (&this->super_IfcFlowTreatmentDeviceType,&PTR_construction_vtable_24__00918fc0);
  *(undefined8 *)&(this->super_IfcFlowTreatmentDeviceType).field_0x1b8 = 0;
  *(undefined8 *)
   &(this->super_IfcFlowTreatmentDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject =
       0x918e40;
  *(undefined8 *)&this->field_0x1e0 = 0x918fa8;
  *(undefined8 *)
   &(this->super_IfcFlowTreatmentDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
    field_0x88 = 0x918e68;
  (this->super_IfcFlowTreatmentDeviceType).super_IfcDistributionFlowElementType.
  super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)0x918e90;
  *(undefined8 *)
   &(this->super_IfcFlowTreatmentDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
    field_0xf0 = 0x918eb8;
  *(undefined8 *)
   &(this->super_IfcFlowTreatmentDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.field_0x148 =
       0x918ee0;
  *(undefined8 *)
   &(this->super_IfcFlowTreatmentDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.field_0x180 = 0x918f08;
  *(undefined8 *)
   &(this->super_IfcFlowTreatmentDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.field_0x190 = 0x918f30;
  *(undefined8 *)
   &(this->super_IfcFlowTreatmentDeviceType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.field_0x1a0 = 0x918f58;
  *(undefined8 *)
   &(this->super_IfcFlowTreatmentDeviceType).super_IfcDistributionFlowElementType.field_0x1b0 =
       0x918f80;
  *(undefined1 **)&(this->super_IfcFlowTreatmentDeviceType).field_0x1c0 = &this->field_0x1d0;
  *(undefined8 *)&this->field_0x1c8 = 0;
  this->field_0x1d0 = 0;
  return;
}

Assistant:

IfcFilterType() : Object("IfcFilterType") {}